

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::createMaxConcurrentTest<vkt::api::(anonymous_namespace)::Framebuffer>
          (TestStatus *__return_storage_ptr__,Context *context)

{
  Environment *this;
  RefData<vk::Handle<(vk::HandleType)23>_> data;
  ulong __n;
  TestContext *pTVar1;
  TestLog *this_00;
  MessageBuilder *pMVar2;
  Unique<vk::Handle<(vk::HandleType)23>_> *this_01;
  reference this_02;
  allocator<char> local_3a1;
  string local_3a0;
  undefined1 local_379;
  Move<vk::Handle<(vk::HandleType)23>_> local_378;
  RefData<vk::Handle<(vk::HandleType)23>_> local_358;
  SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_> local_338;
  uint local_324;
  char *pcStack_320;
  deUint32 ndx;
  MessageBuilder local_318;
  undefined4 local_198;
  deUint32 watchdogInterval;
  allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_> local_181;
  undefined1 local_180 [8];
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
  objects;
  Resources res;
  Environment env;
  deUint32 numObjects;
  Context *context_local;
  TestStatus *local_10;
  
  local_10 = __return_storage_ptr__;
  env._52_4_ = Framebuffer::getMaxConcurrent(context,(Parameters *)((long)&context_local + 7));
  this = (Environment *)
         &res.renderPass.object.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
          m_allocator;
  Environment::Environment(this,context,env._52_4_);
  Framebuffer::Resources::Resources
            ((Resources *)
             &objects.
              super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,this,
             (Parameters *)((long)&context_local + 7));
  __n = (ulong)(uint)env._52_4_;
  std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>::
  allocator(&local_181);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
            *)local_180,__n,&local_181);
  std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>::
  ~allocator(&local_181);
  local_198 = 0x400;
  pTVar1 = Context::getTestContext(context);
  this_00 = tcu::TestContext::getLog(pTVar1);
  tcu::TestLog::operator<<(&local_318,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_318,(char (*) [10])"Creating ");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(uint *)&env.field_0x34);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x13b8ff9);
  pcStack_320 = ::vk::getTypeName<vk::Handle<(vk::HandleType)23>>();
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&stack0xfffffffffffffce0);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [9])0x13837bb);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_318);
  for (local_324 = 0; local_324 < (uint)env._52_4_; local_324 = local_324 + 1) {
    this_01 = (Unique<vk::Handle<(vk::HandleType)23>_> *)operator_new(0x20);
    local_379 = 1;
    Framebuffer::create(&local_378,
                        (Environment *)
                        &res.renderPass.object.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data
                         .deleter.m_allocator,
                        (Resources *)
                        &objects.
                         super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        (Parameters *)((long)&context_local + 7));
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_358,(Move *)&local_378);
    data.deleter.m_deviceIface = local_358.deleter.m_deviceIface;
    data.object.m_internal = local_358.object.m_internal;
    data.deleter.m_device = local_358.deleter.m_device;
    data.deleter.m_allocator = local_358.deleter.m_allocator;
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::Unique(this_01,data);
    local_379 = 0;
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>::SharedPtr
              (&local_338,this_01);
    this_02 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
              ::operator[]((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
                            *)local_180,(ulong)local_324);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>::operator=
              (this_02,&local_338);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>::~SharedPtr(&local_338);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move(&local_378);
    if ((local_324 != 0) && ((local_324 & 0x3ff) == 0)) {
      pTVar1 = Context::getTestContext(context);
      tcu::TestContext::touchWatchdog(pTVar1);
    }
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
  ::clear((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
           *)local_180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a0,"Ok",&local_3a1);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_3a0);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::allocator<char>::~allocator(&local_3a1);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
             *)local_180);
  Framebuffer::Resources::~Resources
            ((Resources *)
             &objects.
              super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMaxConcurrentTest (Context& context, typename Object::Parameters params)
{
	typedef Unique<typename Object::Type>	UniqueObject;
	typedef SharedPtr<UniqueObject>			ObjectPtr;

	const deUint32						numObjects			= Object::getMaxConcurrent(context, params);
	const Environment					env					(context, numObjects);
	const typename Object::Resources	res					(env, params);
	vector<ObjectPtr>					objects				(numObjects);
	const deUint32						watchdogInterval	= 1024;

	context.getTestContext().getLog()
		<< TestLog::Message << "Creating " << numObjects << " " << getTypeName<typename Object::Type>() << " objects" << TestLog::EndMessage;

	for (deUint32 ndx = 0; ndx < numObjects; ndx++)
	{
		objects[ndx] = ObjectPtr(new UniqueObject(Object::create(env, res, params)));

		if ((ndx > 0) && ((ndx % watchdogInterval) == 0))
			context.getTestContext().touchWatchdog();
	}

	objects.clear();

	return tcu::TestStatus::pass("Ok");
}